

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
drawBufferRange(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                *this,int begin,int end)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x538))(0,(long)begin / 0x10 & 0xffffffff,1);
  UNRECOVERED_JUMPTABLE = *(code **)(CONCAT44(extraout_var,iVar1) + 0x538);
  (*UNRECOVERED_JUMPTABLE)(0,end / 0x10 + -1,1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::drawBufferRange (int begin, int end)
{
	DE_ASSERT(begin % (int)sizeof(float[4]) == 0);
	DE_ASSERT(end % (int)sizeof(float[4]) == 0);

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// use given range
	gl.drawArrays(GL_POINTS, begin / (int)sizeof(float[4]), 1);
	gl.drawArrays(GL_POINTS, end / (int)sizeof(float[4]) - 1, 1);
}